

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::StringFieldGenerator::GenerateMergingCode
          (StringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (other.has$capitalized_name$()) {\n  $set_has_field_bit_builder$;\n  $name$_ = other.$name$_;\n  $on_changed$\n}\n"
                    );
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  // Allow a slight breach of abstraction here in order to avoid forcing
  // all string fields to Strings when copying fields from a Message.
  printer->Print(variables_,
    "if (other.has$capitalized_name$()) {\n"
    "  $set_has_field_bit_builder$;\n"
    "  $name$_ = other.$name$_;\n"
    "  $on_changed$\n"
    "}\n");
}